

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O2

ASTList * ParseArgs(Scope *scope,Lexer *lexer)

{
  ASTListItem *pAVar1;
  Token TVar2;
  ASTList *pAVar3;
  ASTListItem *pAVar4;
  ASTNode *pAVar5;
  char *pcVar6;
  
  TVar2 = GetNextToken(lexer);
  if (TVar2 == LPAREN) {
    pAVar3 = GetNextASTList(scope);
    TVar2 = LPAREN;
    while (TVar2 != RPAREN) {
      pAVar4 = GetNextASTListItem(scope);
      pAVar5 = ParseExpression(scope,lexer);
      pAVar4->node = pAVar5;
      pAVar1 = pAVar3->current;
      pAVar4->prev = pAVar1;
      if (pAVar1 != (ASTListItem *)0x0) {
        pAVar1->next = pAVar4;
      }
      pAVar3->current = pAVar4;
      if (pAVar3->first == (ASTListItem *)0x0) {
        pAVar3->first = pAVar4;
      }
      TVar2 = GetCurrentToken(lexer);
    }
    pAVar3->last = pAVar3->current;
    return pAVar3;
  }
  pcVar6 = TokenToString(TVar2);
  printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","LPAREN",pcVar6,
         (ulong)(uint)(lexer->tracker).row,
         (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
  exit(0);
}

Assistant:

ASTList* ParseArgs(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("Func Args");
	TRACK();
	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, LPAREN, lexer);
	ASTList* list = GetNextASTList(scope);

	while (tok != RPAREN){
		// tok = GetNextToken(lexer);
		ASTListItem* item = GetNextASTListItem(scope);
		item->node = ParseExpression(scope, lexer);
		item->prev = list->current;

		if (list->current != NULL) list->current->next = item;

		list->current = item;
		if (list->first == NULL) list->first = item;
		tok = GetCurrentToken(lexer);
	}
	list->last = list->current;

	return list;
}